

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O0

int hostkey_method_ssh_ecdsa_signv
              (LIBSSH2_SESSION *session,uchar **signature,size_t *signature_len,int veccount,
              iovec *datavec,void **abstract)

{
  EVP_PKEY *ec_ctx_00;
  libssh2_curve_type lVar1;
  int iVar2;
  int local_114;
  int i_2;
  EVP_MD_CTX *ctx_2;
  uchar hash_2 [64];
  int i_1;
  EVP_MD_CTX *ctx_1;
  uchar hash_1 [48];
  int i;
  EVP_MD_CTX *ctx;
  uchar hash [32];
  int local_50;
  int ret;
  libssh2_curve_type type;
  EVP_PKEY *ec_ctx;
  void **abstract_local;
  iovec *datavec_local;
  int veccount_local;
  size_t *signature_len_local;
  uchar **signature_local;
  LIBSSH2_SESSION *session_local;
  
  ec_ctx_00 = (EVP_PKEY *)*abstract;
  lVar1 = _libssh2_ecdsa_get_curve_type(ec_ctx_00);
  local_50 = 0;
  if (lVar1 == LIBSSH2_EC_CURVE_NISTP256) {
    iVar2 = _libssh2_sha256_init((EVP_MD_CTX **)&stack0xffffffffffffff80);
    if (iVar2 == 0) {
      local_50 = -1;
    }
    else {
      hash_1[0x2c] = '\0';
      hash_1[0x2d] = '\0';
      hash_1[0x2e] = '\0';
      hash_1[0x2f] = '\0';
      for (; (int)hash_1._44_4_ < veccount; hash_1._44_4_ = hash_1._44_4_ + 1) {
        iVar2 = _libssh2_sha256_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff80,
                           datavec[(int)hash_1._44_4_].iov_base,datavec[(int)hash_1._44_4_].iov_len)
        ;
        if (iVar2 == 0) {
          local_50 = -1;
          break;
        }
      }
      if (local_50 != -1) {
        iVar2 = _libssh2_sha256_final((EVP_MD_CTX **)&stack0xffffffffffffff80,(uchar *)&ctx);
        if (iVar2 == 0) {
          local_50 = -1;
        }
        else {
          local_50 = _libssh2_ecdsa_sign(session,ec_ctx_00,(uchar *)&ctx,0x20,signature,
                                         signature_len);
        }
      }
    }
  }
  else if (lVar1 == LIBSSH2_EC_CURVE_NISTP384) {
    iVar2 = _libssh2_sha384_init((EVP_MD_CTX **)&stack0xffffffffffffff40);
    if (iVar2 == 0) {
      local_50 = -1;
    }
    else {
      hash_2[0x3c] = '\0';
      hash_2[0x3d] = '\0';
      hash_2[0x3e] = '\0';
      hash_2[0x3f] = '\0';
      for (; (int)hash_2._60_4_ < veccount; hash_2._60_4_ = hash_2._60_4_ + 1) {
        iVar2 = _libssh2_sha384_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff40,
                           datavec[(int)hash_2._60_4_].iov_base,datavec[(int)hash_2._60_4_].iov_len)
        ;
        if (iVar2 == 0) {
          local_50 = -1;
          break;
        }
      }
      if (local_50 != -1) {
        iVar2 = _libssh2_sha384_final((EVP_MD_CTX **)&stack0xffffffffffffff40,(uchar *)&ctx_1);
        if (iVar2 == 0) {
          local_50 = -1;
        }
        else {
          local_50 = _libssh2_ecdsa_sign(session,ec_ctx_00,(uchar *)&ctx_1,0x30,signature,
                                         signature_len);
        }
      }
    }
  }
  else {
    if (lVar1 != LIBSSH2_EC_CURVE_NISTP521) {
      return -1;
    }
    iVar2 = _libssh2_sha512_init((EVP_MD_CTX **)&stack0xfffffffffffffef0);
    if (iVar2 == 0) {
      local_50 = -1;
    }
    else {
      for (local_114 = 0; local_114 < veccount; local_114 = local_114 + 1) {
        iVar2 = _libssh2_sha512_update
                          ((EVP_MD_CTX **)&stack0xfffffffffffffef0,datavec[local_114].iov_base,
                           datavec[local_114].iov_len);
        if (iVar2 == 0) {
          local_50 = -1;
          break;
        }
      }
      if (local_50 != -1) {
        iVar2 = _libssh2_sha512_final((EVP_MD_CTX **)&stack0xfffffffffffffef0,(uchar *)&ctx_2);
        if (iVar2 == 0) {
          local_50 = -1;
        }
        else {
          local_50 = _libssh2_ecdsa_sign(session,ec_ctx_00,(uchar *)&ctx_2,0x40,signature,
                                         signature_len);
        }
      }
    }
  }
  return local_50;
}

Assistant:

static int
hostkey_method_ssh_ecdsa_signv(LIBSSH2_SESSION * session,
                               unsigned char **signature,
                               size_t *signature_len,
                               int veccount,
                               const struct iovec datavec[],
                               void **abstract)
{
    libssh2_ecdsa_ctx *ec_ctx = (libssh2_ecdsa_ctx *) (*abstract);
    libssh2_curve_type type = _libssh2_ecdsa_get_curve_type(ec_ctx);
    int ret = 0;

    if(type == LIBSSH2_EC_CURVE_NISTP256) {
        LIBSSH2_HOSTKEY_METHOD_EC_SIGNV_HASH(256);
    }
    else if(type == LIBSSH2_EC_CURVE_NISTP384) {
        LIBSSH2_HOSTKEY_METHOD_EC_SIGNV_HASH(384);
    }
    else if(type == LIBSSH2_EC_CURVE_NISTP521) {
        LIBSSH2_HOSTKEY_METHOD_EC_SIGNV_HASH(512);
    }
    else {
        return -1;
    }

    return ret;
}